

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsimg.cpp
# Opt level: O0

int __thiscall
CTcParser::load_object_file
          (CTcParser *this,CVmFile *fp,textchar_t *fname,tctarg_obj_id_t *obj_xlat,
          tctarg_prop_id_t *prop_xlat,ulong *enum_xlat)

{
  int iVar1;
  tctarg_obj_id_t tVar2;
  ulong uVar3;
  CTcSymbol **ppCVar4;
  CTcDictEntry **ppCVar5;
  ulong *enum_xlat_00;
  ulong uVar6;
  CTcSymbol *pCVar7;
  tctarg_prop_id_t *prop_xlat_00;
  CVmFile *pCVar8;
  CTcPrsExport *pCVar9;
  CVmFile *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  CTcParser *in_RDI;
  undefined8 in_R8;
  CTcPrsExport *exp;
  CTcSymObj *match_sym;
  CTcSymbol *sym_1;
  ulong idx_1;
  CTcSymbol *sym;
  ulong idx;
  tctarg_obj_id_t id;
  ulong exp_cnt;
  ulong prod_cnt;
  ulong nonsym_cnt;
  ulong anon_cnt;
  ulong i;
  ulong dict_cnt;
  ulong sym_cnt;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  CTcParser *in_stack_ffffffffffffff58;
  CVmFile *in_stack_ffffffffffffff60;
  tctarg_obj_id_t *in_stack_ffffffffffffff68;
  textchar_t *in_stack_ffffffffffffff70;
  CVmFile *in_stack_ffffffffffffff78;
  ulong uVar10;
  ulong *puVar11;
  tctarg_prop_id_t *ptVar12;
  CVmFile *pCVar13;
  
  uVar3 = CVmFile::read_uint4((CVmFile *)in_RDI);
  if (uVar3 != 0) {
    ppCVar4 = (CTcSymbol **)malloc(uVar3 << 3);
    in_RDI->obj_sym_list_ = ppCVar4;
    in_RDI->obj_file_sym_idx_ = 0;
  }
  uVar3 = CVmFile::read_uint4((CVmFile *)in_RDI);
  if (uVar3 != 0) {
    ppCVar5 = (CTcDictEntry **)malloc(uVar3 << 3);
    in_RDI->obj_dict_list_ = ppCVar5;
    in_RDI->obj_file_dict_idx_ = 0;
  }
  uVar3 = CVmFile::read_uint4((CVmFile *)in_RDI);
  for (uVar10 = 0; uVar10 < uVar3; uVar10 = uVar10 + 1) {
    iVar1 = CTcSymbolBase::load_from_obj_file
                      (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68
                       ,(tctarg_prop_id_t *)in_stack_ffffffffffffff60,
                       (ulong *)in_stack_ffffffffffffff58);
    if (iVar1 != 0) {
      return 1;
    }
  }
  uVar3 = CVmFile::read_uint4((CVmFile *)in_RDI);
  for (uVar10 = 0; uVar10 < uVar3; uVar10 = uVar10 + 1) {
    iVar1 = CTcSymObjBase::load_from_obj_file
                      (in_stack_ffffffffffffff60,(textchar_t *)in_stack_ffffffffffffff58,
                       (tctarg_obj_id_t *)in_RDI,in_stack_ffffffffffffff4c);
    if (iVar1 != 0) {
      return 1;
    }
  }
  enum_xlat_00 = (ulong *)CVmFile::read_uint4((CVmFile *)in_RDI);
  for (puVar11 = (ulong *)0x0; puVar11 < enum_xlat_00; puVar11 = (ulong *)((long)puVar11 + 1)) {
    uVar3 = CVmFile::read_uint4((CVmFile *)in_RDI);
    tVar2 = CTcGenTarg::new_obj_id(G_cg);
    *(tctarg_obj_id_t *)((long)&in_RCX->fp_ + (uVar3 & 0xffffffff) * 4) = tVar2;
  }
  uVar3 = CVmFile::read_uint4((CVmFile *)in_RDI);
  for (uVar10 = 0; uVar10 < uVar3; uVar10 = uVar10 + 1) {
    uVar6 = CVmFile::read_uint4((CVmFile *)in_RDI);
    pCVar7 = get_objfile_sym(in_RDI,(uint)uVar6);
    (*(pCVar7->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry[0xb])
              (pCVar7,in_RSI,in_RDX,in_RCX,in_R8);
  }
  prop_xlat_00 = (tctarg_prop_id_t *)CVmFile::read_uint4((CVmFile *)in_RDI);
  for (ptVar12 = (tctarg_prop_id_t *)0x0; ptVar12 < prop_xlat_00;
      ptVar12 = (tctarg_prop_id_t *)((long)ptVar12 + 1)) {
    uVar3 = CVmFile::read_uint4((CVmFile *)in_RDI);
    pCVar7 = get_objfile_sym(in_RDI,(uint)uVar3);
    (*(pCVar7->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry[0xb])
              (pCVar7,in_RSI,in_RDX,in_RCX,in_R8);
  }
  pCVar8 = (CVmFile *)CVmFile::read_uint4((CVmFile *)in_RDI);
  for (pCVar13 = (CVmFile *)0x0; pCVar13 < pCVar8; pCVar13 = (CVmFile *)((long)&pCVar13->fp_ + 1)) {
    CTcGramProdEntry::load_from_obj_file(pCVar13,prop_xlat_00,enum_xlat_00,(CTcSymObj *)pCVar8);
  }
  pCVar8 = (CVmFile *)CVmFile::read_uint4((CVmFile *)in_RDI);
  for (pCVar13 = (CVmFile *)0x0; pCVar13 < pCVar8; pCVar13 = (CVmFile *)((long)&pCVar13->fp_ + 1)) {
    CVmFile::read_uint4((CVmFile *)in_RDI);
    get_objfile_objsym(in_stack_ffffffffffffff58,(uint)((ulong)in_RDI >> 0x20));
    CTcGramProdEntry::load_from_obj_file(pCVar13,prop_xlat_00,enum_xlat_00,(CTcSymObj *)pCVar8);
  }
  uVar3 = CVmFile::read_uint4((CVmFile *)in_RDI);
  uVar10 = 0;
  while( true ) {
    if (uVar3 <= uVar10) {
      if (in_RDI->obj_sym_list_ != (CTcSymbol **)0x0) {
        free(in_RDI->obj_sym_list_);
        in_RDI->obj_sym_list_ = (CTcSymbol **)0x0;
      }
      if (in_RDI->obj_dict_list_ != (CTcDictEntry **)0x0) {
        free(in_RDI->obj_dict_list_);
        in_RDI->obj_dict_list_ = (CTcDictEntry **)0x0;
      }
      return 0;
    }
    pCVar9 = CTcPrsExport::read_from_obj_file(in_RCX);
    if (pCVar9 == (CTcPrsExport *)0x0) break;
    add_export_to_list(in_RDI,(CTcPrsExport *)
                              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    uVar10 = uVar10 + 1;
  }
  return 1;
}

Assistant:

int CTcParser::load_object_file(class CVmFile *fp, const textchar_t *fname,
                                tctarg_obj_id_t *obj_xlat,
                                tctarg_prop_id_t *prop_xlat,
                                ulong *enum_xlat)
{
    ulong sym_cnt;
    ulong dict_cnt;
    ulong i;
    ulong anon_cnt;
    ulong nonsym_cnt;
    ulong prod_cnt;
    ulong exp_cnt;

    /* read the number of symbol index entries */
    sym_cnt = fp->read_uint4();
    if (sym_cnt != 0)
    {
        /* allocate space for the symbol index list */
        obj_sym_list_ = (CTcSymbol **)
                        t3malloc(sym_cnt * sizeof(obj_sym_list_[0]));

        /* the list is empty so far */
        obj_file_sym_idx_ = 0;
    }

    /* read the number of dictionary symbols */
    dict_cnt = fp->read_uint4();

    /* if there are any symbols, read them */
    if (dict_cnt != 0)
    {
        /* allocate space for the dictionary index list */
        obj_dict_list_ = (CTcDictEntry **)
                         t3malloc(dict_cnt * sizeof(obj_dict_list_[0]));

        /* nothing in the list yet */
        obj_file_dict_idx_ = 0;
    }

    /* read the number of symbols in the file */
    sym_cnt = fp->read_uint4();

    /* read the symbols */
    for (i = 0 ; i < sym_cnt ; ++i)
    {
        /* load a symbol */
        if (CTcSymbol::load_from_obj_file(fp, fname,
                                          obj_xlat, prop_xlat, enum_xlat))
            return 1;
    }

    /* read the number of anonymous object symbols */
    anon_cnt = fp->read_uint4();

    /* read the anonymous object symbols */
    for (i = 0 ; i < anon_cnt ; ++i)
    {
        /* load the next anonymous object symbol */
        if (CTcSymObj::load_from_obj_file(fp, fname, obj_xlat, TRUE))
            return 1;
    }

    /* read the non-symbol object ID's */
    nonsym_cnt = fp->read_uint4();
    for (i = 0 ; i < nonsym_cnt ; ++i)
    {
        tctarg_obj_id_t id;

        /* read the next non-symbol object ID */
        id = (tctarg_obj_id_t)fp->read_uint4();

        /* 
         *   allocate a new ID for the object, and set the translation
         *   table for the new ID - this will ensure that references to
         *   this non-symbol object are properly fixed up 
         */
        obj_xlat[id] = G_cg->new_obj_id();
    }

    /* read the number of symbol cross-reference sections in the file */
    sym_cnt = fp->read_uint4();

    /* read the symbol cross-references */
    for (i = 0 ; i < sym_cnt ; ++i)
    {
        ulong idx;
        CTcSymbol *sym;

        /* read the symbol index */
        idx = fp->read_uint4();

        /* get the symbol from the index list */
        sym = get_objfile_sym(idx);

        /* load the symbol's reference information */
        sym->load_refs_from_obj_file(fp, fname, obj_xlat, prop_xlat);
    }

    /* read the number of anonymous object cross-references */
    anon_cnt = fp->read_uint4();

    /* read the anonymous object cross-references */
    for (i = 0 ; i < anon_cnt ; ++i)
    {
        ulong idx;
        CTcSymbol *sym;

        /* read the symbol index */
        idx = fp->read_uint4();

        /* get the symbol from the index list */
        sym = get_objfile_sym(idx);

        /* load the symbol's reference information */
        sym->load_refs_from_obj_file(fp, fname, obj_xlat, prop_xlat);
    }

    /* read the master grammar rule count */
    prod_cnt = fp->read_uint4();

    /* read the master grammar rule list */
    for (i = 0 ; i < prod_cnt ; ++i)
    {
        /* read the next grammar production */
        CTcGramProdEntry::load_from_obj_file(fp, prop_xlat, enum_xlat, 0);
    }

    /* read the number of named grammar rules */
    prod_cnt = fp->read_uint4();

    /* read the private grammar rules */
    for (i = 0 ; i < prod_cnt ; ++i)
    {
        CTcSymObj *match_sym;

        /* read the match object defining the rule */
        match_sym = get_objfile_objsym(fp->read_uint4());

        /* read the private rule list */
        CTcGramProdEntry::load_from_obj_file(
            fp, prop_xlat, enum_xlat, match_sym);
    }

    /* read the export symbol list */
    exp_cnt = fp->read_uint4();
    for (i = 0 ; i < exp_cnt ; ++i)
    {
        CTcPrsExport *exp;
        
        /* read the next entry */
        exp = CTcPrsExport::read_from_obj_file(fp);

        /* if that failed, the whole load fails */
        if (exp == 0)
            return 1;

        /* add it to our list */
        add_export_to_list(exp);
    }

    /* done with the symbol index list - free it */
    if (obj_sym_list_ != 0)
    {
        /* free it and forget it */
        t3free(obj_sym_list_);
        obj_sym_list_ = 0;
    }

    /* done with the dictionary index list - free it */
    if (obj_dict_list_ != 0)
    {
        /* free the memory and forget it */
        t3free(obj_dict_list_);
        obj_dict_list_ = 0;
    }

    /* success */
    return 0;
}